

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsLoads.h
# Opt level: O3

ChShaftsTorsionSpringDamper * __thiscall
chrono::ChShaftsTorsionSpringDamper::Clone(ChShaftsTorsionSpringDamper *this)

{
  double dVar1;
  ChShaftsTorsionSpringDamper *this_00;
  
  this_00 = (ChShaftsTorsionSpringDamper *)::operator_new(0x88);
  ChObj::ChObj((ChObj *)this_00,(ChObj *)this);
  (this_00->super_ChShaftsLoad).super_ChLoadCustomMultiple.super_ChLoadBase.jacobians =
       (this->super_ChShaftsLoad).super_ChLoadCustomMultiple.super_ChLoadBase.jacobians;
  (this_00->super_ChShaftsLoad).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj._vptr_ChObj
       = (_func_int **)&PTR__ChLoadCustomMultiple_00b20e70;
  std::
  vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ::vector(&(this_00->super_ChShaftsLoad).super_ChLoadCustomMultiple.loadables,
           &(this->super_ChShaftsLoad).super_ChLoadCustomMultiple.loadables);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)
             &(this_00->super_ChShaftsLoad).super_ChLoadCustomMultiple.load_Q,
             (DenseStorage<double,__1,__1,_1,_0> *)
             &(this->super_ChShaftsLoad).super_ChLoadCustomMultiple.load_Q);
  (this_00->super_ChShaftsLoad).torque = (this->super_ChShaftsLoad).torque;
  (this_00->super_ChShaftsLoad).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj._vptr_ChObj
       = (_func_int **)&PTR__ChLoadCustomMultiple_00b250f0;
  dVar1 = this->damping;
  this_00->stiffness = this->stiffness;
  this_00->damping = dVar1;
  this_00->rest_phase = this->rest_phase;
  return this_00;
}

Assistant:

virtual ChShaftsTorsionSpringDamper* Clone() const override { return new ChShaftsTorsionSpringDamper(*this); }